

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Analyze(Parse *pParse,Token *pName1,Token *pName2)

{
  long lVar1;
  int iVar2;
  sqlite3 *db_00;
  Index *pTab_00;
  Vdbe *p;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Vdbe *v;
  Index *pIdx;
  Table *pTab;
  char *zDb;
  char *z;
  int i;
  int iDb;
  sqlite3 *db;
  Token *pTableName;
  Parse *in_stack_ffffffffffffff98;
  sqlite3 *db_01;
  Token *pName;
  sqlite3 *db_02;
  Parse *pPVar3;
  undefined4 uVar4;
  int iDb_00;
  Parse *pParse_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pParse_00 = (Parse *)*in_RDI;
  iDb_00 = -0x55555556;
  uVar4 = 0xaaaaaaaa;
  pPVar3 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  db_02 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  pName = (Token *)&DAT_aaaaaaaaaaaaaaaa;
  db_01 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  iVar2 = sqlite3ReadSchema((Parse *)&DAT_aaaaaaaaaaaaaaaa);
  if (iVar2 == 0) {
    if (in_RSI == 0) {
      for (iVar2 = 0; iVar2 < *(int *)&pParse_00->mSubrtnSig; iVar2 = iVar2 + 1) {
        if (iVar2 != 1) {
          analyzeDatabase(pParse_00,iDb_00);
        }
      }
    }
    else if ((*(int *)(in_RDX + 8) == 0) && (iVar2 = sqlite3FindDb(db_02,pName), -1 < iVar2)) {
      analyzeDatabase(pParse_00,iVar2);
    }
    else {
      iVar2 = sqlite3TwoPartName(pPVar3,(Token *)db_02,pName,(Token **)db_01);
      if (-1 < iVar2) {
        if (*(int *)(in_RDX + 8) == 0) {
          in_stack_ffffffffffffff98 = (Parse *)0x0;
        }
        else {
          in_stack_ffffffffffffff98 =
               *(Parse **)(*(long *)&pParse_00->isMultiWrite + (long)iVar2 * 0x20);
        }
        pPVar3 = in_stack_ffffffffffffff98;
        db_00 = (sqlite3 *)sqlite3NameFromToken(db_01,(Token *)in_stack_ffffffffffffff98);
        if (db_00 != (sqlite3 *)0x0) {
          pTab_00 = sqlite3FindIndex(db_00,(char *)pPVar3,(char *)db_02);
          if (pTab_00 == (Index *)0x0) {
            pPVar3 = (Parse *)sqlite3LocateTable((Parse *)CONCAT44(iVar2,uVar4),
                                                 (u32)((ulong)db_00 >> 0x20),(char *)pPVar3,
                                                 (char *)db_02);
            if (pPVar3 != (Parse *)0x0) {
              analyzeTable(pPVar3,(Table *)pTab_00,(Index *)db_01);
            }
          }
          else {
            analyzeTable((Parse *)db_02,(Table *)pTab_00,(Index *)db_01);
          }
          sqlite3DbFree(db_01,in_stack_ffffffffffffff98);
        }
      }
    }
    if ((*(char *)&(pParse_00->constraintName).z == '\0') &&
       (p = sqlite3GetVdbe(in_stack_ffffffffffffff98), p != (Vdbe *)0x0)) {
      sqlite3VdbeAddOp0(p,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Analyze(Parse *pParse, Token *pName1, Token *pName2){
  sqlite3 *db = pParse->db;
  int iDb;
  int i;
  char *z, *zDb;
  Table *pTab;
  Index *pIdx;
  Token *pTableName;
  Vdbe *v;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  assert( pName2!=0 || pName1==0 );
  if( pName1==0 ){
    /* Form 1:  Analyze everything */
    for(i=0; i<db->nDb; i++){
      if( i==1 ) continue;  /* Do not analyze the TEMP database */
      analyzeDatabase(pParse, i);
    }
  }else if( pName2->n==0 && (iDb = sqlite3FindDb(db, pName1))>=0 ){
    /* Analyze the schema named as the argument */
    analyzeDatabase(pParse, iDb);
  }else{
    /* Form 3: Analyze the table or index named as an argument */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pTableName);
    if( iDb>=0 ){
      zDb = pName2->n ? db->aDb[iDb].zDbSName : 0;
      z = sqlite3NameFromToken(db, pTableName);
      if( z ){
        if( (pIdx = sqlite3FindIndex(db, z, zDb))!=0 ){
          analyzeTable(pParse, pIdx->pTable, pIdx);
        }else if( (pTab = sqlite3LocateTable(pParse, 0, z, zDb))!=0 ){
          analyzeTable(pParse, pTab, 0);
        }
        sqlite3DbFree(db, z);
      }
    }
  }
  if( db->nSqlExec==0 && (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3VdbeAddOp0(v, OP_Expire);
  }
}